

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::
     DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,
               OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16_t *pcVar5;
  undefined *puVar6;
  
  if ((ulong)data->ViewType < 0xf) {
    puVar6 = (&PTR_anon_var_dwarf_32e0c22_01379f20)[data->ViewType];
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x40e,"(false)","false");
    if (!bVar3) goto LAB_0073cf43;
    *puVar4 = 0;
    puVar6 = (undefined *)0x0;
  }
  switch(op) {
  case Simd128_LdArr_I4:
    DumpInt32x4Reg((uint)data->Value);
    break;
  case Simd128_LdArrConst_I4:
    DumpInt32x4Reg((uint)data->Value);
    goto LAB_0073ced8;
  case Simd128_LdArr_F4:
    DumpFloat32x4Reg((uint)data->Value);
    break;
  case Simd128_LdArrConst_F4:
    DumpFloat32x4Reg((uint)data->Value);
LAB_0073ced8:
    uVar1 = data->SlotIndex;
    pcVar5 = L"= %s[%d] ";
    goto LAB_0073cee1;
  case Simd128_StArr_I4:
    uVar1 = data->SlotIndex;
    pcVar5 = L"%s[I%d] = ";
    goto LAB_0073cf10;
  case Simd128_StArrConst_I4:
    uVar1 = data->SlotIndex;
    pcVar5 = L"%s[%d] = ";
LAB_0073cf10:
    Output::Print(pcVar5,puVar6,(ulong)uVar1);
    DumpInt32x4Reg((uint)data->Value);
    goto LAB_0073ceeb;
  case Simd128_StArr_F4:
    uVar1 = data->SlotIndex;
    pcVar5 = L"%s[I%d] = ";
    goto LAB_0073cf2e;
  case Simd128_StArrConst_F4:
    uVar1 = data->SlotIndex;
    pcVar5 = L"%s[%d] = ";
LAB_0073cf2e:
    Output::Print(pcVar5,puVar6,(ulong)uVar1);
    DumpFloat32x4Reg((uint)data->Value);
    goto LAB_0073ceeb;
  default:
    switch(op) {
    case Simd128_LdArr_I16:
      DumpInt8x16Reg((uint)data->Value);
      goto LAB_0073ce11;
    case Simd128_LdArrConst_I16:
      DumpInt8x16Reg((uint)data->Value);
      goto LAB_0073ced8;
    case Simd128_StArr_I16:
      uVar1 = data->SlotIndex;
      pcVar5 = L"%s[I%d] = ";
      break;
    case Simd128_StArrConst_I16:
      uVar1 = data->SlotIndex;
      pcVar5 = L"%s[%d] = ";
      break;
    default:
      switch(op) {
      case Simd128_LdArr_I8:
        DumpInt16x8Reg((uint)data->Value);
        goto LAB_0073ce11;
      case Simd128_LdArrConst_I8:
        DumpInt16x8Reg((uint)data->Value);
        goto LAB_0073ced8;
      case Simd128_StArr_I8:
        uVar1 = data->SlotIndex;
        pcVar5 = L"%s[I%d] = ";
        break;
      case Simd128_StArrConst_I8:
        uVar1 = data->SlotIndex;
        pcVar5 = L"%s[%d] = ";
        break;
      default:
        switch(op) {
        case Simd128_LdArr_U4:
          DumpUint32x4Reg((uint)data->Value);
          goto LAB_0073ce11;
        case Simd128_LdArrConst_U4:
          DumpUint32x4Reg((uint)data->Value);
          goto LAB_0073ced8;
        case Simd128_StArr_U4:
          uVar1 = data->SlotIndex;
          pcVar5 = L"%s[I%d] = ";
          break;
        case Simd128_StArrConst_U4:
          uVar1 = data->SlotIndex;
          pcVar5 = L"%s[%d] = ";
          break;
        default:
          switch(op) {
          case Simd128_LdArr_U8:
            DumpUint16x8Reg((uint)data->Value);
            goto LAB_0073ce11;
          case Simd128_LdArrConst_U8:
            DumpUint16x8Reg((uint)data->Value);
            goto LAB_0073ced8;
          case Simd128_StArr_U8:
            uVar1 = data->SlotIndex;
            pcVar5 = L"%s[I%d] = ";
            break;
          case Simd128_StArrConst_U8:
            uVar1 = data->SlotIndex;
            pcVar5 = L"%s[%d] = ";
            break;
          default:
            switch(op) {
            case Simd128_LdArr_U16:
              DumpUint8x16Reg((uint)data->Value);
              goto LAB_0073ce11;
            case Simd128_LdArrConst_U16:
              DumpUint8x16Reg((uint)data->Value);
              goto LAB_0073ced8;
            case Simd128_StArr_U16:
              uVar1 = data->SlotIndex;
              pcVar5 = L"%s[I%d] = ";
              break;
            case Simd128_StArrConst_U16:
              uVar1 = data->SlotIndex;
              pcVar5 = L"%s[%d] = ";
              break;
            default:
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar4 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                          ,0x432,"(false)","false");
              if (!bVar3) {
LAB_0073cf43:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar4 = 0;
              goto LAB_0073ceeb;
            }
            Output::Print(pcVar5,puVar6,(ulong)uVar1);
            DumpUint8x16Reg((uint)data->Value);
            goto LAB_0073ceeb;
          }
          Output::Print(pcVar5,puVar6,(ulong)uVar1);
          DumpUint16x8Reg((uint)data->Value);
          goto LAB_0073ceeb;
        }
        Output::Print(pcVar5,puVar6,(ulong)uVar1);
        DumpUint32x4Reg((uint)data->Value);
        goto LAB_0073ceeb;
      }
      Output::Print(pcVar5,puVar6,(ulong)uVar1);
      DumpInt16x8Reg((uint)data->Value);
      goto LAB_0073ceeb;
    }
    Output::Print(pcVar5,puVar6,(ulong)uVar1);
    DumpInt8x16Reg((uint)data->Value);
    goto LAB_0073ceeb;
  }
LAB_0073ce11:
  uVar1 = data->SlotIndex;
  pcVar5 = L"= %s[I%d] ";
LAB_0073cee1:
  Output::Print(pcVar5,puVar6,(ulong)uVar1);
LAB_0073ceeb:
  Output::Print(L" %d bytes ",(ulong)(uint)(int)data->DataWidth);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmSimdTypedArr(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        const char16* heapTag = nullptr;

        switch (data->ViewType)
        {
        case ArrayBufferView::TYPE_INT8:
        case ArrayBufferView::TYPE_INT8_TO_INT64:
            heapTag = _u("HEAP8"); break;
        case ArrayBufferView::TYPE_UINT8:
        case ArrayBufferView::TYPE_UINT8_TO_INT64:
            heapTag = _u("HEAPU8"); break;
        case ArrayBufferView::TYPE_INT16:
        case ArrayBufferView::TYPE_INT16_TO_INT64:
            heapTag = _u("HEAP16"); break;
        case ArrayBufferView::TYPE_UINT16:
        case ArrayBufferView::TYPE_UINT16_TO_INT64:
            heapTag = _u("HEAPU16"); break;
        case ArrayBufferView::TYPE_INT32:
        case ArrayBufferView::TYPE_INT32_TO_INT64:
            heapTag = _u("HEAP32"); break;
        case ArrayBufferView::TYPE_UINT32:
        case ArrayBufferView::TYPE_UINT32_TO_INT64:
            heapTag = _u("HEAPU32"); break;
        case ArrayBufferView::TYPE_FLOAT32:
            heapTag = _u("HEAPF32"); break;
        case ArrayBufferView::TYPE_FLOAT64:
            heapTag = _u("HEAPF64"); break;
        case ArrayBufferView::TYPE_INT64:
            heapTag = _u("HEAPI64"); break;
        default:
            Assert(false);
            __assume(false);
            break;
        }

#define SIMD_DUMP_ARR_I4 DumpInt32x4Reg
#define SIMD_DUMP_ARR_I8 DumpInt16x8Reg
#define SIMD_DUMP_ARR_I16 DumpInt8x16Reg
#define SIMD_DUMP_ARR_U4 DumpUint32x4Reg
#define SIMD_DUMP_ARR_U8 DumpUint16x8Reg
#define SIMD_DUMP_ARR_U16 DumpUint8x16Reg
#define SIMD_DUMP_ARR_F4 DumpFloat32x4Reg
#define SIMD_DUMP_ARR_D2 DumpFloat64x2Reg
#define SIMD_DUMP_ARR_I2 DumpInt64x2Reg
#define SIMD_DUMP_REG(type) SIMD_DUMP_ARR_##type(data->Value)
#define SIMD_DUMP_ARR_VALUE(type) \
        case OpCodeAsmJs::Simd128_LdArr_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[I%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_LdArrConst_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_StArr_##type:\
            Output::Print(_u("%s[I%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\
        case OpCodeAsmJs::Simd128_StArrConst_##type:\
            Output::Print(_u("%s[%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\

        switch (op)
        {
            SIMD_DUMP_ARR_VALUE(I4)
            SIMD_DUMP_ARR_VALUE(I8)
            SIMD_DUMP_ARR_VALUE(I16)
            SIMD_DUMP_ARR_VALUE(U4)
            SIMD_DUMP_ARR_VALUE(U8)
            SIMD_DUMP_ARR_VALUE(U16)
            SIMD_DUMP_ARR_VALUE(F4)
            //SIMD_DUMP_ARR_VALUE(D2)
        default:
            Assert(false);
            __assume(false);
            break;
        }

        // data width
        Output::Print(_u(" %d bytes "), data->DataWidth);
    }